

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_int>::Body
          (iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_int> *this)

{
  Fixed *pFVar1;
  uint *v;
  AssertionHelper local_798;
  string local_768;
  Fixed local_748;
  AssertionHelper local_5c0;
  string local_590;
  Fixed local_570;
  AssertionHelper local_3e8;
  string local_3b8;
  Fixed local_398;
  AssertionHelper local_210;
  string local_1d0;
  Fixed local_1b0;
  undefined4 local_28;
  uint local_24;
  TypeParam_conflict6 d;
  TypeParam_conflict6 c;
  TypeParam_conflict6 *b;
  iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_int> *piStack_10;
  TypeParam_conflict6 a;
  iu_TypedPrintToTest_x_iutest_x_Print_Test<unsigned_int> *this_local;
  
  b._4_4_ = 0;
  local_24 = 0;
  local_28 = 0;
  _d = (uint *)((long)&b + 4);
  piStack_10 = this;
  memset(&local_1b0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1b0);
  iutest::PrintToString<unsigned_int>(&local_1d0,(uint *)((long)&b + 4));
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1b0,&local_1d0);
  iutest::AssertionHelper::AssertionHelper
            (&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3db,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_210,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1b0);
  memset(&local_398,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_398);
  iutest::PrintToString<unsigned_int>(&local_3b8,_d);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_398,&local_3b8);
  iutest::AssertionHelper::AssertionHelper
            (&local_3e8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dc,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_3e8,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3b8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_398);
  memset(&local_570,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_570);
  iutest::PrintToString<unsigned_int>(&local_590,&local_24);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_570,&local_590);
  iutest::AssertionHelper::AssertionHelper
            (&local_5c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3dd,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_5c0,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_5c0);
  std::__cxx11::string::~string((string *)&local_590);
  iutest::AssertionHelper::Fixed::~Fixed(&local_570);
  memset(&local_748,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_748);
  iutest::PrintToString<unsigned_int_volatile>(&local_768,(iutest *)&local_28,v);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_748,&local_768);
  iutest::AssertionHelper::AssertionHelper
            (&local_798,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3de,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_798,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_798);
  std::__cxx11::string::~string((string *)&local_768);
  iutest::AssertionHelper::Fixed::~Fixed(&local_748);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedPrintToTest, Print)
{
    TypeParam a = 0;
    TypeParam& b = a;
    const TypeParam c = a;
    const volatile TypeParam d = a;

    IUTEST_SUCCEED() << ::iutest::PrintToString(a);
    IUTEST_SUCCEED() << ::iutest::PrintToString(b);
    IUTEST_SUCCEED() << ::iutest::PrintToString(c);
    IUTEST_SUCCEED() << ::iutest::PrintToString(d);
}